

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFrameworkDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  cmValue cVar2;
  cmAlphaNum local_a0;
  string local_70;
  cmAlphaNum local_50;
  
  GetOutputName(&local_70,this,config,RuntimeBinaryArtifact);
  local_a0.View_._M_len = local_70._M_string_length;
  local_a0.View_._M_str = local_70._M_dataplus._M_p;
  local_50.View_._M_str = local_50.Digits_;
  local_50.View_._M_len = 1;
  local_50.Digits_[0] = '.';
  cmStrCat<>(__return_storage_ptr__,&local_a0,&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"BUNDLE_EXTENSION",(allocator<char> *)&local_50);
  cVar2 = GetProperty(this,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (cVar2.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"framework",(allocator<char> *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_a0,(string *)cVar2.Value);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_a0);
  if (level == FullLevel) {
    bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      GetFrameworkVersion_abi_cxx11_((string *)&local_a0,this);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetOutputName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  cmValue ext = this->GetProperty("BUNDLE_EXTENSION");
  fpath += (ext ? *ext : "framework");
  if (shouldAddFullLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Versions/";
    fpath += this->GetFrameworkVersion();
  }
  return fpath;
}